

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::HashUtil::Output256(ByteData256 *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  string local_40;
  
  if (this->hash_type_ == '\x04') {
    Sha256D(__return_storage_ptr__,&this->buffer_);
  }
  else {
    if (this->hash_type_ != '\x03') {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown hash type.","")
      ;
      CfdException::CfdException(this_00,kCfdInternalError,&local_40);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Sha256(__return_storage_ptr__,&this->buffer_);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Output256() {
  switch (hash_type_) {
    case kSha256:
      return Sha256(buffer_);
    case kSha256D:
      return Sha256D(buffer_);
    case kRipemd160:
      // fall-through
    case kHash160:
      // fall-through
    case kSha512:
      // fall-through
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}